

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O3

void * __thiscall osQueue::Peek(osQueue *this)

{
  void *pvVar1;
  
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x48);
  if (this->ElementCount == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = this->Array[this->NextOutIndex];
  }
  osMutex::Give(&this->Lock);
  return pvVar1;
}

Assistant:

void* osQueue::Peek()
{
    void* rc;

    Lock.Take(__FILE__, __LINE__);

    if (ElementCount != 0)
    {
        rc = Array[NextOutIndex];
    }
    else
    {
        rc = nullptr;
    }

    Lock.Give();
    return rc;
}